

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O1

void __thiscall
rr::LineExitDiamondGenerator::rasterize
          (LineExitDiamondGenerator *this,LineExitDiamond *lineDiamonds,int maxDiamonds,
          int *numWritten)

{
  int *piVar1;
  bool bVar2;
  int i_1;
  int iVar3;
  long lVar4;
  int iVar5;
  float fVar6;
  Vector<float,_2> vec;
  SubpixelLineSegment line;
  undefined1 local_98 [8];
  long lStack_90;
  SubpixelLineSegment local_80;
  int *local_60;
  LineExitDiamond *local_58;
  long local_50 [4];
  
  local_80.m_v0.m_data[1] = 0x100000000;
  local_98 = (undefined1  [8])0x0;
  lVar4 = 0;
  do {
    *(float *)(local_98 + lVar4 * 4) =
         (this->m_v0).m_data[*(int *)((long)local_80.m_v0.m_data + lVar4 * 4 + 8)];
    lVar4 = lVar4 + 1;
  } while (lVar4 == 1);
  local_80.m_v0.m_data[0] =
       (long)((float)local_98._0_4_ * 256.0 +
             (float)(~-(uint)((float)local_98._0_4_ < 0.0) & 0x3f000000 |
                    -(uint)((float)local_98._0_4_ < 0.0) & 0xbf000000));
  bVar2 = (float)local_98._4_4_ < 0.0;
  fVar6 = (float)local_98._4_4_ * 256.0;
  local_80.m_v0.m_data[1] = 0x100000000;
  local_98 = (undefined1  [8])0x0;
  lVar4 = 0;
  do {
    *(float *)(local_98 + lVar4 * 4) =
         (this->m_v1).m_data[*(int *)((long)local_80.m_v0.m_data + lVar4 * 4 + 8)];
    lVar4 = lVar4 + 1;
  } while (lVar4 == 1);
  local_80.m_v1.m_data[1] =
       (long)((float)local_98._4_4_ * 256.0 +
             (float)(~-(uint)((float)local_98._4_4_ < 0.0) & 0x3f000000 |
                    -(uint)((float)local_98._4_4_ < 0.0) & 0xbf000000));
  local_80.m_v0.m_data[1] =
       (long)(fVar6 + (float)(~-(uint)bVar2 & 0x3f000000 | -(uint)bVar2 & 0xbf000000));
  local_80.m_v1.m_data[0] =
       (long)((float)local_98._0_4_ * 256.0 +
             (float)(~-(uint)((float)local_98._0_4_ < 0.0) & 0x3f000000 |
                    -(uint)((float)local_98._0_4_ < 0.0) & 0xbf000000));
  iVar3 = (this->m_curPos).m_data[1];
  iVar5 = 0;
  local_60 = numWritten;
  if (0 < maxDiamonds && iVar3 <= (this->m_bboxMax).m_data[1]) {
    iVar5 = 0;
    local_58 = lineDiamonds;
    do {
      local_50[2] = (long)((this->m_curPos).m_data[0] << 8);
      local_50[3] = (long)(iVar3 << 8);
      local_50[0] = 0x80;
      local_50[1] = 0x80;
      local_98 = (undefined1  [8])0x0;
      lStack_90 = 0;
      lVar4 = 0;
      do {
        *(long *)(local_98 + lVar4 * 8) = local_50[lVar4] + local_50[lVar4 + 2];
        lVar4 = lVar4 + 1;
      } while (lVar4 == 1);
      bVar2 = LineRasterUtil::doesLineSegmentExitDiamond(&local_80,(Vector<long,_2> *)local_98);
      if (bVar2) {
        *(undefined8 *)local_58[iVar5].position.m_data = *(undefined8 *)(this->m_curPos).m_data;
        iVar5 = iVar5 + 1;
      }
      iVar3 = (this->m_curPos).m_data[0] + 1;
      (this->m_curPos).m_data[0] = iVar3;
      if ((this->m_bboxMax).m_data[0] < iVar3) {
        piVar1 = (this->m_curPos).m_data + 1;
        *piVar1 = *piVar1 + 1;
        (this->m_curPos).m_data[0] = (this->m_bboxMin).m_data[0];
      }
      iVar3 = (this->m_curPos).m_data[1];
    } while ((iVar3 <= (this->m_bboxMax).m_data[1]) && (iVar5 < maxDiamonds));
  }
  *local_60 = iVar5;
  return;
}

Assistant:

void LineExitDiamondGenerator::rasterize (LineExitDiamond* const lineDiamonds, const int maxDiamonds, int& numWritten)
{
	DE_ASSERT(maxDiamonds > 0);

	const deInt64								halfPixel			= 1ll << (RASTERIZER_SUBPIXEL_BITS-1);
	const tcu::Vector<deInt64,2>				pa					= LineRasterUtil::toSubpixelVector(m_v0.xy());
	const tcu::Vector<deInt64,2>				pb					= LineRasterUtil::toSubpixelVector(m_v1.xy());
	const LineRasterUtil::SubpixelLineSegment	line				= LineRasterUtil::SubpixelLineSegment(pa, pb);

	int											diamondNdx			= 0;

	while (m_curPos.y() <= m_bboxMax.y() && diamondNdx < maxDiamonds)
	{
		const tcu::Vector<deInt64,2> diamondPosition = LineRasterUtil::toSubpixelVector(m_curPos) + tcu::Vector<deInt64,2>(halfPixel,halfPixel);

		if (LineRasterUtil::doesLineSegmentExitDiamond(line, diamondPosition))
		{
			LineExitDiamond& packet = lineDiamonds[diamondNdx];
			packet.position = m_curPos;
			++diamondNdx;
		}

		++m_curPos.x();
		if (m_curPos.x() > m_bboxMax.x())
		{
			++m_curPos.y();
			m_curPos.x() = m_bboxMin.x();
		}
	}

	DE_ASSERT(diamondNdx <= maxDiamonds);
	numWritten = diamondNdx;
}